

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O0

int __thiscall
anon_unknown.dwarf_360fd2::NumberTreeDetails::compareKeys
          (NumberTreeDetails *this,QPDFObjectHandle *a,QPDFObjectHandle *b)

{
  byte bVar1;
  logic_error *this_00;
  longlong lVar2;
  longlong lVar3;
  bool bVar4;
  uint local_b4;
  byte local_91;
  longlong bs;
  longlong as;
  QPDFObjectHandle local_50 [2];
  QPDFObjectHandle local_30;
  QPDFObjectHandle *local_20;
  QPDFObjectHandle *b_local;
  QPDFObjectHandle *a_local;
  NumberTreeDetails *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (QPDFObjectHandle *)this;
  QPDFObjectHandle::QPDFObjectHandle(&local_30,a);
  bVar1 = (**(code **)((long)*this + 8))(this,&local_30);
  bVar4 = (bVar1 & 1) != 0;
  local_91 = 0;
  if (bVar4) {
    QPDFObjectHandle::QPDFObjectHandle(local_50,b);
    local_91 = (**(code **)((long)*this + 8))(this,local_50);
  }
  if (bVar4) {
    QPDFObjectHandle::~QPDFObjectHandle(local_50);
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  if (((local_91 ^ 0xff) & 1) == 0) {
    lVar2 = QPDFObjectHandle::getIntValue(a);
    lVar3 = QPDFObjectHandle::getIntValue(b);
    if (lVar2 < lVar3) {
      local_b4 = 0xffffffff;
    }
    else {
      local_b4 = (uint)(lVar3 < lVar2);
    }
    return local_b4;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"comparing invalid keys");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int
        compareKeys(QPDFObjectHandle a, QPDFObjectHandle b) const override
        {
            if (!(keyValid(a) && keyValid(b))) {
                // We don't call this without calling keyValid first
                throw std::logic_error("comparing invalid keys");
            }
            auto as = a.getIntValue();
            auto bs = b.getIntValue();
            return ((as < bs) ? -1 : (as > bs) ? 1 : 0);
        }